

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

bool Datetime::valid(int y,int d)

{
  if (d < 1 || y < 0) {
    return false;
  }
  return (uint)d <=
         (((uint)(y * -0x3d70a3d7) >> 4 | y * -0x70000000) < 0xa3d70b ||
         0x28f5c28 < ((uint)(y * -0x3d70a3d7) >> 2 | y * 0x40000000) && (y & 3U) == 0) + 0x16d;
}

Assistant:

bool Datetime::valid (const int y, const int d)
{
  // Check that the year is valid.
  if (y < 0)
    return false;

  if (d < 1 || d > Datetime::daysInYear (y))
    return false;

  return true;
}